

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void train_node(log_multi *b,single_learner *base,example *ec,uint32_t *current,
               uint32_t *class_index,uint32_t param_6)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  node *pnVar4;
  node_pred *pnVar5;
  uint *in_RCX;
  example *in_RDX;
  learner<char,_example> *in_RSI;
  long in_RDI;
  uint *in_R8;
  learner<char,_example> *i;
  example *ec_00;
  learner<char,_example> *in_stack_ffffffffffffffa0;
  
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  fVar1 = pnVar4->norm_Eh;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar5 = v_array<node_pred>::operator[](&pnVar4->preds,(ulong)*in_R8);
  if (fVar1 < pnVar5->norm_Ehk || fVar1 == pnVar5->norm_Ehk) {
    (in_RDX->l).multi.label = 0x3f800000;
  }
  else {
    (in_RDX->l).multi.label = 0xbf800000;
  }
  i = in_RSI;
  ec_00 = in_RDX;
  v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  LEARNER::learner<char,_example>::learn(in_stack_ffffffffffffffa0,ec_00,(size_t)i);
  (in_RDX->l).multi.label = 0x7f7fffff;
  v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  LEARNER::learner<char,_example>::predict(in_RSI,ec_00,(size_t)i);
  fVar1 = in_RDX->partial_prediction;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar4->Eh = pnVar4->Eh + (double)fVar1;
  fVar1 = in_RDX->partial_prediction;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar5 = v_array<node_pred>::operator[](&pnVar4->preds,(ulong)*in_R8);
  pnVar5->Ehk = pnVar5->Ehk + (double)fVar1;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar4->n = pnVar4->n + 1;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar5 = v_array<node_pred>::operator[](&pnVar4->preds,(ulong)*in_R8);
  pnVar5->nk = pnVar5->nk + 1;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  dVar2 = pnVar4->Eh;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  uVar3 = pnVar4->n;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar4->norm_Eh = (float)dVar2 / (float)uVar3;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar5 = v_array<node_pred>::operator[](&pnVar4->preds,(ulong)*in_R8);
  dVar2 = pnVar5->Ehk;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar5 = v_array<node_pred>::operator[](&pnVar4->preds,(ulong)*in_R8);
  uVar3 = pnVar5->nk;
  pnVar4 = v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RCX);
  pnVar5 = v_array<node_pred>::operator[](&pnVar4->preds,(ulong)*in_R8);
  pnVar5->norm_Ehk = (float)dVar2 / (float)uVar3;
  return;
}

Assistant:

void train_node(
    log_multi& b, single_learner& base, example& ec, uint32_t& current, uint32_t& class_index, uint32_t /* depth */)
{
  if (b.nodes[current].norm_Eh > b.nodes[current].preds[class_index].norm_Ehk)
    ec.l.simple.label = -1.f;
  else
    ec.l.simple.label = 1.f;

  base.learn(ec, b.nodes[current].base_predictor);  // depth

  ec.l.simple.label = FLT_MAX;
  base.predict(ec, b.nodes[current].base_predictor);  // depth

  b.nodes[current].Eh += (double)ec.partial_prediction;
  b.nodes[current].preds[class_index].Ehk += (double)ec.partial_prediction;
  b.nodes[current].n++;
  b.nodes[current].preds[class_index].nk++;

  b.nodes[current].norm_Eh = (float)b.nodes[current].Eh / b.nodes[current].n;
  b.nodes[current].preds[class_index].norm_Ehk =
      (float)b.nodes[current].preds[class_index].Ehk / b.nodes[current].preds[class_index].nk;
}